

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O3

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<5,_2,_3>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  long lVar1;
  Vector<float,_3> *in_RCX;
  ulong uVar2;
  Type in0;
  Vector<float,_2> local_68;
  float local_60 [2];
  undefined8 local_58;
  float local_50;
  ulong local_48;
  int aiStack_40 [6];
  Matrix<float,_2,_3> local_28;
  
  uVar2 = CONCAT44((int)((uint)(in0Type == INPUTTYPE_DYNAMIC) << 0x1f) >> 0x1f,
                   (int)((uint)(in0Type == INPUTTYPE_DYNAMIC) << 0x1f) >> 0x1f);
  local_48 = ~uVar2 & (ulong)DAT_00ae38f0 | *(ulong *)(evalCtx->coords).m_data & uVar2;
  if (in1Type == INPUTTYPE_DYNAMIC) {
    local_60[0] = (evalCtx->coords).m_data[2];
    local_68.m_data = *(float (*) [2])(evalCtx->coords).m_data;
  }
  else {
    local_68.m_data[0] = -0.2;
    local_68.m_data[1] = 0.5;
    local_60[0] = 0.8;
  }
  outerProduct<float,3,2>(&local_28,(MatrixCaseUtils *)&local_48,&local_68,in_RCX);
  local_58 = CONCAT44(local_28.m_data.m_data[1].m_data[1] + local_28.m_data.m_data[1].m_data[0],
                      local_28.m_data.m_data[0].m_data[0] + local_28.m_data.m_data[0].m_data[1]);
  local_50 = local_28.m_data.m_data[2].m_data[0] + local_28.m_data.m_data[2].m_data[1];
  aiStack_40[2] = 0;
  aiStack_40[3] = 1;
  aiStack_40[4] = 2;
  lVar1 = 2;
  do {
    (evalCtx->color).m_data[aiStack_40[lVar1]] = local_60[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(outerProduct(in0, in1));
	}